

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_eval_grid.h
# Opt level: O2

void __thiscall
embree::avx::PatchEvalGrid::PatchEvalGrid
          (PatchEvalGrid *this,undefined8 param_2,undefined8 param_3,uint param_4,uint param_5,
          uint param_6,uint param_7,uint param_8,undefined4 param_9,Vec2<float> param_10,
          float *param_11,float *param_12,float *param_13,float *param_14,float *param_15,
          float *param_16,float *param_17,uint param_18,uint param_19)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  BBox2f erange;
  
  this->x0 = param_4;
  this->x1 = param_5;
  this->y0 = param_6;
  this->y1 = param_7;
  this->swidth = param_8;
  this->sheight = (uint)erange.lower.field_0.field_0.x;
  auVar4 = vpinsrd_avx(ZEXT416(param_8),erange.lower.field_0.field_0.x,1);
  auVar4 = vpmovzxdq_avx(auVar4);
  auVar3._8_8_ = 0x4330000000000000;
  auVar3._0_8_ = 0x4330000000000000;
  auVar4 = vpor_avx(auVar4,auVar3);
  auVar4 = vsubpd_avx(auVar4,auVar3);
  auVar4 = vcvtpd2ps_avx(auVar4);
  auVar2._0_4_ = auVar4._0_4_ + -1.0;
  auVar2._4_4_ = auVar4._4_4_ + -1.0;
  auVar2._8_4_ = auVar4._8_4_ + -1.0;
  auVar2._12_4_ = auVar4._12_4_ + -1.0;
  auVar4._8_4_ = 0x3f800000;
  auVar4._0_8_ = 0x3f8000003f800000;
  auVar4._12_4_ = 0x3f800000;
  auVar4 = vdivps_avx(auVar4,auVar2);
  uVar1 = vmovlps_avx(auVar4);
  this->rcp_swidth = (float)(int)uVar1;
  this->rcp_sheight = (float)(int)((ulong)uVar1 >> 0x20);
  this->Px = (float *)erange.upper.field_0;
  this->Py = param_11;
  this->Pz = param_12;
  this->U = param_13;
  this->V = param_14;
  this->Nx = param_15;
  this->Ny = param_16;
  this->Nz = param_17;
  this->dwidth = param_18;
  this->dheight = param_19;
  this->count = 0;
  eval();
  return;
}

Assistant:

PatchEvalGrid (Ref patch, unsigned subPatch,
                     const unsigned x0, const unsigned x1, const unsigned y0, const unsigned y1, const unsigned swidth, const unsigned sheight, 
                     float* Px, float* Py, float* Pz, float* U, float* V, 
                     float* Nx, float* Ny, float* Nz,
                     const unsigned dwidth, const unsigned dheight)
      : x0(x0), x1(x1), y0(y0), y1(y1), swidth(swidth), sheight(sheight), rcp_swidth(1.0f/(swidth-1.0f)), rcp_sheight(1.0f/(sheight-1.0f)), 
        Px(Px), Py(Py), Pz(Pz), U(U), V(V), Nx(Nx), Ny(Ny), Nz(Nz), dwidth(dwidth), dheight(dheight), count(0)
      {
        assert(swidth < (2<<20) && sheight < (2<<20));
        const BBox2f srange(Vec2f(0.0f,0.0f),Vec2f(float(swidth-1),float(sheight-1)));
        const BBox2f erange(Vec2f(float(x0),float(y0)),Vec2f((float)x1,(float)y1));
        bool done MAYBE_UNUSED = eval(patch,subPatch,srange,erange);
        assert(done);
        assert(count == (x1-x0+1)*(y1-y0+1));
      }